

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O0

string_stream * __thiscall
argh::parser::operator()
          (string_stream *__return_storage_ptr__,parser *this,
          initializer_list<const_char_*const> init_list)

{
  char *pcVar1;
  bool bVar2;
  const_iterator ppcVar3;
  pointer ppVar4;
  _Self local_b0 [3];
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [32];
  _Self local_50;
  const_iterator optIt;
  char **name;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*const> *__range1;
  parser *this_local;
  initializer_list<const_char_*const> init_list_local;
  
  init_list_local._M_array = (iterator)init_list._M_len;
  this_local = (parser *)init_list._M_array;
  init_list_local._M_len = (size_type)__return_storage_ptr__;
  __end1 = std::initializer_list<const_char_*const>::begin
                     ((initializer_list<const_char_*const> *)&this_local);
  ppcVar3 = std::initializer_list<const_char_*const>::end
                      ((initializer_list<const_char_*const> *)&this_local);
  while( true ) {
    if (__end1 == ppcVar3) {
      bad_stream(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    optIt._M_node = (_Base_ptr)__end1;
    pcVar1 = *__end1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar1,&local_91);
    trim_leading_dashes((parser *)local_70,(string *)this);
    local_50._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->params_,(key_type *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    local_b0[0]._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->params_);
    bVar2 = std::operator!=(local_b0,&local_50);
    if (bVar2) break;
    __end1 = __end1 + 1;
  }
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_50);
  stringstream_proxy::stringstream_proxy(__return_storage_ptr__,&ppVar4->second);
  return __return_storage_ptr__;
}

Assistant:

inline string_stream parser::operator()(std::initializer_list<char const* const> init_list) const
   {
      for (auto& name : init_list)
      {
         auto optIt = params_.find(trim_leading_dashes(name));
         if (params_.end() != optIt)
            return string_stream(optIt->second);
      }
      return bad_stream();
   }